

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_color(element_t *element,int id,color_t *color,_Bool inherit)

{
  _Bool _Var1;
  string_t *psVar2;
  char *it;
  char *local_10;
  
  psVar2 = find_attribute(element,id,inherit);
  if (psVar2 != (string_t *)0x0) {
    local_10 = psVar2->data;
    _Var1 = parse_color_value(&local_10,local_10 + psVar2->length,color);
    psVar2 = (string_t *)(ulong)_Var1;
  }
  return SUB81(psVar2,0);
}

Assistant:

static bool parse_color(const element_t* element, int id, color_t* color, bool inherit)
{
    const string_t* value = find_attribute(element, id, inherit);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(parse_color_value(&it, end, color))
        return it == end;
    return false;
}